

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O0

void __thiscall blockfilter_tests::blockfilters_json_test::test_method(blockfilters_json_test *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  string_view hex_str;
  string_view hex_str_00;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  UniValue *pUVar4;
  uint256 *puVar5;
  optional<uint256> *poVar6;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint ii;
  UniValue *prev_scripts;
  CTxUndo *tx_undo;
  uint pos;
  UniValue *test;
  uint i;
  UniValue *tests;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter_basic;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_script;
  CBlockUndo block_undo;
  uint256 computed_header_basic;
  BlockFilter computed_filter_basic;
  uint256 filter_header_basic;
  uint256 prev_filter_header_basic;
  CTxOut txout;
  CBlock block;
  string strTest;
  UniValue json;
  CBlock *in_stack_fffffffffffff7d8;
  undefined7 in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7e7;
  undefined7 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ef;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7ff;
  CBlock *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  int in_stack_fffffffffffff80c;
  lazy_ostream *in_stack_fffffffffffff810;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  GCSFilter *in_stack_fffffffffffff828;
  CBlock *in_stack_fffffffffffff830;
  BlockFilter *in_stack_fffffffffffff840;
  CBlock *in_stack_fffffffffffff848;
  uint local_61c;
  uint local_5e4;
  const_string local_5c0 [2];
  lazy_ostream local_5a0 [2];
  assertion_result local_580 [2];
  const_string local_548 [2];
  lazy_ostream local_528 [2];
  assertion_result local_508 [3];
  undefined1 local_4b5;
  undefined4 local_4b4;
  undefined8 local_4b0;
  const_string local_478 [2];
  lazy_ostream local_458 [2];
  assertion_result local_438 [2];
  const_string local_400 [2];
  lazy_ostream local_3e0 [2];
  assertion_result local_3c0 [2];
  const_string local_388 [3];
  lazy_ostream local_358 [2];
  assertion_result local_338 [2];
  const_string local_300;
  lazy_ostream local_2f0 [2];
  assertion_result local_2d0 [2];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_80 [120];
  long local_8;
  BlockFilterType filter_type;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff7d8);
  local_298 = 0x4598;
  uStack_290 = 0x1bc1b90;
  uVar2 = UniValue::read((UniValue *)(local_80 + 0x20),0x4598,(void *)0x1bc1b90,in_RCX);
  if (((uVar2 & 1) == 0) ||
     (bVar1 = UniValue::isArray((UniValue *)in_stack_fffffffffffff7d8), !bVar1)) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                 (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                 (unsigned_long)in_stack_fffffffffffff7d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                 (const_string *)in_stack_fffffffffffff810,
                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                 (const_string *)in_stack_fffffffffffff800);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                 (bool)in_stack_fffffffffffff7e7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                 (char (*) [13])in_stack_fffffffffffff7d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                 (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                 (unsigned_long)in_stack_fffffffffffff7d8);
      in_stack_fffffffffffff7d8 = (CBlock *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2d0,local_2f0,&local_300,0x86,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>
                          *)in_stack_fffffffffffff7d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  else {
    UniValue::get_array((UniValue *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
    for (local_5e4 = 0; sVar3 = UniValue::size((UniValue *)in_stack_fffffffffffff7d8),
        local_5e4 < sVar3; local_5e4 = local_5e4 + 1) {
      pUVar4 = UniValue::operator[]
                         ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                          CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
      UniValue::write_abi_cxx11_((UniValue *)local_80,(int)pUVar4,(void *)0x0,0);
      sVar3 = UniValue::size((UniValue *)in_stack_fffffffffffff7d8);
      if (sVar3 != 1) {
        sVar3 = UniValue::size((UniValue *)in_stack_fffffffffffff7d8);
        if (sVar3 < 7) {
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                       (const_string *)in_stack_fffffffffffff810,
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (const_string *)in_stack_fffffffffffff800);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (bool)in_stack_fffffffffffff7e7);
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0)
                       ,(char (*) [11])in_stack_fffffffffffff7d8);
            boost::unit_test::operator<<
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                        *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            in_stack_fffffffffffff7d8 = (CBlock *)0x0;
            boost::test_tools::tt_detail::report_assertion(local_338,local_358,local_388,0x92,CHECK)
            ;
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)in_stack_fffffffffffff7d8);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>::
            ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                                *)in_stack_fffffffffffff7d8);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff7d8);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar1);
        }
        else {
          UniValue::operator[]
                    ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                     CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          UniValue::getInt<int>((UniValue *)in_stack_fffffffffffff830);
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                       (const_string *)in_stack_fffffffffffff810,
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (const_string *)in_stack_fffffffffffff800);
            UniValue::operator[]
                      ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
            UniValue::get_str_abi_cxx11_
                      ((UniValue *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
            str._M_str._0_7_ = in_stack_fffffffffffff7f8;
            str._M_len = (size_t)in_stack_fffffffffffff7f0._M_current;
            str._M_str._7_1_ = in_stack_fffffffffffff7ff;
            uint256::FromHex(str);
            boost::test_tools::assertion_result::assertion_result<std::optional<uint256>>
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (optional<uint256> *)
                       CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            in_stack_fffffffffffff7d8 = (CBlock *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_3c0,local_3e0,local_400,0x98,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff7d8);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff7d8);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar1);
          CBlock::CBlock((CBlock *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                       (const_string *)in_stack_fffffffffffff810,
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (const_string *)in_stack_fffffffffffff800);
            UniValue::operator[]
                      ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
            UniValue::get_str_abi_cxx11_
                      ((UniValue *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
            DecodeHexBlk(in_stack_fffffffffffff848,(string *)in_stack_fffffffffffff840);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (bool)in_stack_fffffffffffff7e7);
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            in_stack_fffffffffffff7d8 = (CBlock *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_438,local_458,local_478,0x9b,REQUIRE,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff7d8);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff7d8);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar1);
          CBlockUndo::CBlockUndo((CBlockUndo *)in_stack_fffffffffffff7d8);
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::emplace_back<>
                    ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)
                     CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::back
                    ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffff7d8);
          UniValue::operator[]
                    ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                     CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          UniValue::get_array((UniValue *)
                              CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
          for (local_61c = 0; sVar3 = UniValue::size((UniValue *)in_stack_fffffffffffff7d8),
              local_61c < sVar3; local_61c = local_61c + 1) {
            UniValue::operator[]
                      ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
            UniValue::get_str_abi_cxx11_
                      ((UniValue *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
            hex_str._M_str = (char *)in_stack_fffffffffffff848;
            hex_str._M_len = (size_t)in_stack_fffffffffffff840;
            ParseHex<unsigned_char>(hex_str);
            local_4b0 = 0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
            first._M_current._7_1_ = in_stack_fffffffffffff7ff;
            first._M_current._0_7_ = in_stack_fffffffffffff7f8;
            CScript::
            CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ((CScript *)in_stack_fffffffffffff7d8,first,in_stack_fffffffffffff7f0);
            CTxOut::CTxOut((CTxOut *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                           (CAmount *)in_stack_fffffffffffff810,
                           (CScript *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))
            ;
            CScript::~CScript((CScript *)in_stack_fffffffffffff7d8);
            local_4b4 = 0;
            local_4b5 = 0;
            std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut&,int,bool>
                      ((vector<Coin,_std::allocator<Coin>_> *)
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (CTxOut *)in_stack_fffffffffffff800,
                       (int *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                       (bool *)in_stack_fffffffffffff7f0._M_current);
            CTxOut::~CTxOut((CTxOut *)in_stack_fffffffffffff7d8);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          }
          UniValue::operator[]
                    ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                     CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          UniValue::get_str_abi_cxx11_
                    ((UniValue *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
          str_00._M_str._0_7_ = in_stack_fffffffffffff7f8;
          str_00._M_len = (size_t)in_stack_fffffffffffff7f0._M_current;
          str_00._M_str._7_1_ = in_stack_fffffffffffff7ff;
          uint256::FromHex(str_00);
          inline_assertion_check<true,std::optional<uint256>>
                    ((optional<uint256> *)
                     CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                     (char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                     (char *)in_stack_fffffffffffff800,
                     (char *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
          puVar5 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffff7d8)
          ;
          local_188 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
          uStack_180 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
          local_178 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
          uStack_170 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
          UniValue::operator[]
                    ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                     CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          UniValue::get_str_abi_cxx11_
                    ((UniValue *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
          hex_str_00._M_str = (char *)in_stack_fffffffffffff848;
          hex_str_00._M_len = (size_t)in_stack_fffffffffffff840;
          ParseHex<unsigned_char>(hex_str_00);
          in_stack_fffffffffffff848 =
               (CBlock *)
               UniValue::operator[]
                         ((UniValue *)in_stack_fffffffffffff7f0._M_current,
                          CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          in_stack_fffffffffffff840 =
               (BlockFilter *)
               UniValue::get_str_abi_cxx11_
                         ((UniValue *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0))
          ;
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
          str_01._M_str._0_7_ = in_stack_fffffffffffff7f8;
          str_01._M_len = (size_t)in_stack_fffffffffffff7f0._M_current;
          str_01._M_str._7_1_ = in_stack_fffffffffffff7ff;
          uint256::FromHex(str_01);
          poVar6 = inline_assertion_check<true,std::optional<uint256>>
                             ((optional<uint256> *)
                              CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                              (char *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                              (char *)in_stack_fffffffffffff800,
                              (char *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8))
          ;
          filter_type = (BlockFilterType)((ulong)poVar6 >> 0x38);
          puVar5 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffff7d8)
          ;
          local_1d8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
          uStack_1d0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
          local_1c8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
          uStack_1c0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
          BlockFilter::BlockFilter
                    (in_stack_fffffffffffff840,filter_type,in_stack_fffffffffffff830,
                     (CBlockUndo *)in_stack_fffffffffffff828);
          do {
            in_stack_fffffffffffff830 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                       (const_string *)in_stack_fffffffffffff810,
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (const_string *)in_stack_fffffffffffff800);
            in_stack_fffffffffffff828 =
                 BlockFilter::GetFilter((BlockFilter *)in_stack_fffffffffffff7d8);
            GCSFilter::GetEncoded((GCSFilter *)in_stack_fffffffffffff7d8);
            in_stack_fffffffffffff81f =
                 std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffff800);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (bool)in_stack_fffffffffffff7e7);
            in_stack_fffffffffffff810 = boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            in_stack_fffffffffffff7d8 = (CBlock *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_508,local_528,local_548,0xac,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff7d8);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff7d8);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
            in_stack_fffffffffffff80c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff80c);
          } while (bVar1);
          BlockFilter::ComputeHeader
                    ((BlockFilter *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                     (uint256 *)in_stack_fffffffffffff7f0._M_current);
          do {
            in_stack_fffffffffffff800 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),
                       (const_string *)in_stack_fffffffffffff810,
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (const_string *)in_stack_fffffffffffff800);
            in_stack_fffffffffffff7ff =
                 ::operator==((base_blob<256U> *)
                              CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                              (base_blob<256U> *)
                              CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0));
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (bool)in_stack_fffffffffffff7e7);
            in_stack_fffffffffffff7f0._M_current =
                 (uchar *)boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)
                       CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                       (pointer)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       (unsigned_long)in_stack_fffffffffffff7d8);
            in_stack_fffffffffffff7d8 = (CBlock *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_580,local_5a0,local_5c0,0xaf,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff7d8);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff7d8);
            in_stack_fffffffffffff7ef = boost::test_tools::tt_detail::dummy_cond();
          } while ((bool)in_stack_fffffffffffff7ef);
          BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffff7d8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
          CBlockUndo::~CBlockUndo((CBlockUndo *)in_stack_fffffffffffff7d8);
          CBlock::~CBlock(in_stack_fffffffffffff7d8);
        }
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7d8);
    }
  }
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff7d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilters_json_test)
{
    UniValue json;
    if (!json.read(json_tests::blockfilters) || !json.isArray()) {
        BOOST_ERROR("Parse error.");
        return;
    }

    const UniValue& tests = json.get_array();
    for (unsigned int i = 0; i < tests.size(); i++) {
        const UniValue& test = tests[i];
        std::string strTest = test.write();

        if (test.size() == 1) {
            continue;
        } else if (test.size() < 7) {
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }

        unsigned int pos = 0;
        /*int block_height =*/ test[pos++].getInt<int>();
        BOOST_CHECK(uint256::FromHex(test[pos++].get_str()));

        CBlock block;
        BOOST_REQUIRE(DecodeHexBlk(block, test[pos++].get_str()));

        CBlockUndo block_undo;
        block_undo.vtxundo.emplace_back();
        CTxUndo& tx_undo = block_undo.vtxundo.back();
        const UniValue& prev_scripts = test[pos++].get_array();
        for (unsigned int ii = 0; ii < prev_scripts.size(); ii++) {
            std::vector<unsigned char> raw_script = ParseHex(prev_scripts[ii].get_str());
            CTxOut txout(0, CScript(raw_script.begin(), raw_script.end()));
            tx_undo.vprevout.emplace_back(txout, 0, false);
        }

        uint256 prev_filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};
        std::vector<unsigned char> filter_basic = ParseHex(test[pos++].get_str());
        uint256 filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};

        BlockFilter computed_filter_basic(BlockFilterType::BASIC, block, block_undo);
        BOOST_CHECK(computed_filter_basic.GetFilter().GetEncoded() == filter_basic);

        uint256 computed_header_basic = computed_filter_basic.ComputeHeader(prev_filter_header_basic);
        BOOST_CHECK(computed_header_basic == filter_header_basic);
    }
}